

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__bmp_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi__uint32 sVar2;
  stbi__uint32 sVar3;
  int iVar4;
  int *in_RCX;
  stbi__uint32 *in_RDX;
  stbi__uint32 *in_RSI;
  stbi__context *in_RDI;
  int hsz;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  sVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
  ;
  if ((sVar1 != 'B') ||
     (sVar1 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
     sVar1 != 'M')) {
    stbi__rewind(in_RDI);
    return 0;
  }
  stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  sVar2 = stbi__get32le((stbi__context *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (((sVar2 != 0xc) && (((sVar2 != 0x28 && (sVar2 != 0x38)) && (sVar2 != 0x6c)))) &&
     (sVar2 != 0x7c)) {
    stbi__rewind(in_RDI);
    return 0;
  }
  if (sVar2 == 0xc) {
    sVar3 = stbi__get16le((stbi__context *)CONCAT44(0xc,in_stack_ffffffffffffffd0));
    *in_RSI = sVar3;
    sVar3 = stbi__get16le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffd0));
    *in_RDX = sVar3;
  }
  else {
    sVar3 = stbi__get32le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffd0));
    *in_RSI = sVar3;
    sVar3 = stbi__get32le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffd0));
    *in_RDX = sVar3;
  }
  iVar4 = stbi__get16le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffd0));
  if (iVar4 != 1) {
    stbi__rewind(in_RDI);
    return 0;
  }
  iVar4 = stbi__get16le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffd0));
  *in_RCX = iVar4 / 8;
  return 1;
}

Assistant:

static int stbi__bmp_info(stbi__context *s, int *x, int *y, int *comp)
{
   int hsz;
   if (stbi__get8(s) != 'B' || stbi__get8(s) != 'M') {
       stbi__rewind( s );
       return 0;
   }
   stbi__skip(s,12);
   hsz = stbi__get32le(s);
   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108 && hsz != 124) {
       stbi__rewind( s );
       return 0;
   }
   if (hsz == 12) {
      *x = stbi__get16le(s);
      *y = stbi__get16le(s);
   } else {
      *x = stbi__get32le(s);
      *y = stbi__get32le(s);
   }
   if (stbi__get16le(s) != 1) {
       stbi__rewind( s );
       return 0;
   }
   *comp = stbi__get16le(s) / 8;
   return 1;
}